

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::WriteServiceDocComment
          (java *this,Printer *printer,ServiceDescriptor *service,Options *options)

{
  undefined2 uVar1;
  undefined4 uVar2;
  char *pcVar3;
  void *pvVar4;
  bool bVar5;
  java *this_00;
  string_view text;
  string_view text_00;
  string_view input;
  SourceLocation location;
  long *local_130;
  long local_128;
  long local_120 [2];
  long *local_110;
  long local_108;
  long local_100 [3];
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  bool local_a0;
  bool bStack_9f;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>((Printer *)this,text);
  uVar1._0_1_ = (bool)service->field_0x4;
  uVar1._1_1_ = (bool)service->field_0x5;
  uVar2._0_1_ = *(bool *)&service->super_SymbolBase;
  uVar2._1_1_ = (bool)service->field_0x1;
  uVar2._2_1_ = (bool)service->field_0x2;
  uVar2._3_1_ = (bool)service->field_0x3;
  local_130 = local_120;
  pcVar3 = (service->all_names_).payload_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,pcVar3 + (long)&service->file_->super_SymbolBase);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,service->merged_features_,
             &service->methods_->super_SymbolBase +
             (long)&(service->merged_features_->super_Message).super_MessageLite);
  local_100[2]._0_2_ = *(undefined2 *)&service[1].all_names_.payload_;
  local_98._24_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._16_8_ = &local_78;
  local_68._M_p = (pointer)&local_58;
  bVar5 = ServiceDescriptor::GetSourceLocation
                    ((ServiceDescriptor *)printer,(SourceLocation *)local_98);
  if (bVar5) {
    local_e8._0_4_ = uVar2;
    local_e8._4_2_ = uVar1;
    local_e0._M_p = (pointer)&local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_130,local_128 + (long)local_130);
    local_c0._M_p = (pointer)&local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_110,local_108 + (long)local_110);
    local_a0 = local_100[2]._0_1_;
    bStack_9f = local_100[2]._1_1_;
    options = (Options *)0x0;
    WriteDocCommentBodyForLocation
              ((Printer *)this,(SourceLocation *)local_98,(Options *)local_e8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._16_8_ != &local_78) {
    operator_delete((void *)local_98._16_8_,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  pvVar4 = (printer->sink_).buffer_;
  this_00 = (java *)(ulong)*(ushort *)((long)pvVar4 + 2);
  input._M_len = ~(ulong)this_00 + (long)pvVar4;
  input._M_str = &options->generate_immutable_code;
  EscapeJavadoc_abi_cxx11_((string *)local_98,this_00,input);
  text_00._M_str = " * Protobuf service {@code $fullname$}\n */\n";
  text_00._M_len = 0x2b;
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)this,text_00,(char (*) [9])"fullname",(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service,
                            const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service, options, /* kdoc */ false);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}